

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

void __thiscall hmi::renderer::renderer(renderer *this,SDL_Window *window)

{
  color4f color;
  int iVar1;
  GLuint GVar2;
  undefined8 uVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pcVar6;
  ostream *this_00;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  unique_ptr<char[],_std::default_delete<char[]>_> info_log;
  GLint info_log_length;
  GLint link_status;
  GLuint fragment_shader_id;
  GLuint vertex_shader_id;
  int err;
  vec<int,_2UL> *in_stack_ffffffffffffff48;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffff50;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 in_stack_ffffffffffffff58;
  GLuint in_stack_ffffffffffffff60;
  GLsizei in_stack_ffffffffffffff64;
  PFNGLGETPROGRAMINFOLOGPROC in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff90;
  GLenum type;
  char *in_stack_ffffffffffffff98;
  int local_48;
  GLint local_44;
  GLuint local_40;
  GLuint local_3c;
  undefined8 local_38;
  float local_2c [2];
  anon_union_8_5_712f1eca_for_vec<int,_2UL>_2 local_24;
  undefined8 local_1c;
  int local_14;
  undefined8 local_10;
  
  type = (GLenum)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  local_10 = in_RSI;
  vec<float,_2UL>::vec((vec<float,_2UL> *)(in_RDI + 2));
  vec<float,_2UL>::vec((vec<float,_2UL> *)(in_RDI + 3));
  *(undefined4 *)(in_RDI + 4) = 0;
  uVar3 = SDL_GL_CreateContext(local_10);
  in_RDI[1] = uVar3;
  if (in_RDI[1] == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to create a context: ");
    pcVar5 = (char *)SDL_GetError();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_14 = SDL_GL_MakeCurrent(*in_RDI,in_RDI[1]);
    if (local_14 != 0) {
      in_stack_ffffffffffffff70 =
           std::operator<<((ostream *)&std::cerr,"Failed to make the context current: ");
      pcVar5 = (char *)SDL_GetError();
      poVar4 = std::operator<<(in_stack_ffffffffffffff70,pcVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    iVar1 = gladLoadGLES2Loader((GLADloadproc)in_stack_ffffffffffffff48);
    if (iVar1 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to load GLES2");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendEquationSeparate)(0x8006,0x8006);
    (*glad_glBlendFuncSeparate)(0x302,0x303,1,0x303);
    local_24.x.data = (vec_accessor<int,_2UL,_0UL>)get_size((renderer *)in_stack_ffffffffffffff58);
    vec<float,_2UL>::vec<int>
              ((vec<float,_2UL> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_RDI[3] = local_1c;
    local_38 = in_RDI[3];
    local_2c = (float  [2])
               operator/(in_stack_ffffffffffffff58.data,
                         (float)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    *&(((anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *)(in_RDI + 2))->x).data = local_2c;
    GVar2 = (*glad_glCreateProgram)();
    *(GLuint *)(in_RDI + 4) = GVar2;
    local_3c = anon_unknown_0::compile_shader(in_stack_ffffffffffffff98,type);
    (*glad_glAttachShader)(*(GLuint *)(in_RDI + 4),local_3c);
    (*glad_glDeleteShader)(local_3c);
    local_40 = anon_unknown_0::compile_shader(in_stack_ffffffffffffff98,type);
    (*glad_glAttachShader)(*(GLuint *)(in_RDI + 4),local_40);
    (*glad_glDeleteShader)(local_40);
    (*glad_glLinkProgram)(*(GLuint *)(in_RDI + 4));
    local_44 = 0;
    (*glad_glGetProgramiv)(*(GLuint *)(in_RDI + 4),0x8b82,&local_44);
    if (local_44 == 0) {
      (*glad_glGetProgramiv)(*(GLuint *)(in_RDI + 4),0x8b84,&local_48);
      if (local_48 < 1) {
        __assert_fail("info_log_length > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/renderer.cc"
                      ,0x90,"hmi::renderer::renderer(SDL_Window *)");
      }
      operator_new__((long)local_48);
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<char*,std::default_delete<char[]>,void,bool>
                (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff60 = *(GLuint *)(in_RDI + 4);
      in_stack_ffffffffffffff68 = glad_glGetProgramInfoLog;
      pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffff50)
      ;
      (*in_stack_ffffffffffffff68)(in_stack_ffffffffffffff60,local_48,(GLsizei *)0x0,pcVar6);
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error while linking the program: ");
      pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                         ((unique_ptr<char[],_std::default_delete<char[]>_> *)poVar4);
      this_00 = std::operator<<(poVar4,pcVar6);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)poVar4);
      in_stack_ffffffffffffff64 = local_48;
    }
    color.field_0._8_8_ = in_stack_ffffffffffffff70;
    color.field_0._0_8_ = in_stack_ffffffffffffff68;
    clear((renderer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),color);
  }
  return;
}

Assistant:

renderer::renderer(SDL_Window *window)
  : m_window(window)
  , m_context(nullptr)
  , m_program(0)
  {
    // create context

    m_context = SDL_GL_CreateContext(window);

    if (m_context == nullptr) {
      std::cerr << "Failed to create a context: " << SDL_GetError() << std::endl;
      return;
    }

    int err = SDL_GL_MakeCurrent(m_window, m_context);

    if (err != 0) {
      std::cerr << "Failed to make the context current: " << SDL_GetError() << std::endl;
    }

    // load GLES2 functions

    if (gladLoadGLES2Loader(SDL_GL_GetProcAddress) == 0) {
      std::cerr << "Failed to load GLES2" << std::endl;
    }

    glEnable(GL_BLEND);
    glBlendEquationSeparate(GL_FUNC_ADD, GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

    // create view

    m_view_size = get_size();
    m_view_center = m_view_size / 2.0f;

    // create shader

    m_program = glCreateProgram();

    GLuint vertex_shader_id = compile_shader(g_vertex_shader, GL_VERTEX_SHADER);
    glAttachShader(m_program, vertex_shader_id);
    glDeleteShader(vertex_shader_id); // the shader is still here because it is attached to the program

    GLuint fragment_shader_id = compile_shader(g_fragment_shader, GL_FRAGMENT_SHADER);
    glAttachShader(m_program, fragment_shader_id);
    glDeleteShader(fragment_shader_id); // the shader is still here because it is attached to the program

    glLinkProgram(m_program);

    GLint link_status = GL_FALSE;
    glGetProgramiv(m_program, GL_LINK_STATUS, &link_status);

    if (link_status == GL_FALSE) {
      GLint info_log_length;
      glGetProgramiv(m_program, GL_INFO_LOG_LENGTH, &info_log_length);

      assert(info_log_length > 0);
      std::unique_ptr<char[]> info_log(new char[info_log_length]);
      glGetProgramInfoLog(m_program, info_log_length, nullptr, info_log.get());

      std::cerr << "Error while linking the program: " << info_log.get() << std::endl;
    }

    // initialize the screen

    clear(color::black);
  }